

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::AnimatedPrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,AnimatedPrimitive *this,Ray *r,
          Float tMax)

{
  Interval IVar1;
  ShapeIntersection *pSVar2;
  ShapeIntersection *pSVar3;
  int vb;
  Float tMax_local;
  type va;
  Float FStack_2d4;
  Interval IStack_2d0;
  Interval IStack_2c8;
  Float FStack_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  Tuple3<pbrt::Normal3,_float> aTStack_2b0 [2];
  MediumInterface *local_298;
  MediumHandle local_290;
  Tuple3<pbrt::Vector3,_float> local_288 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_270 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_258 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_240 [2];
  Tuple3<pbrt::Normal3,_float> TStack_228;
  MaterialHandle local_218;
  LightHandle LStack_210;
  Tuple3<pbrt::Vector3,_float> local_208 [3];
  Float FStack_1e4;
  optional<pbrt::ShapeIntersection> si;
  Ray ray;
  Transform interpRenderFromPrimitive;
  
  tMax_local = tMax;
  AnimatedTransform::Interpolate(&interpRenderFromPrimitive,&this->renderFromPrimitive,r->time);
  Transform::ApplyInverse(&ray,&interpRenderFromPrimitive,r,&tMax_local);
  PrimitiveHandle::Intersect(&si,&this->primitive,&ray,tMax_local);
  if (si.set == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    Transform::operator()((SurfaceInteraction *)&va,&interpRenderFromPrimitive,&pSVar2->intr);
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    (pSVar2->intr).super_Interaction.mediumInterface = local_298;
    IVar1.high = FStack_2d4;
    IVar1.low = va;
    (pSVar2->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = IVar1;
    (pSVar2->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y = IStack_2d0;
    (pSVar2->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IStack_2c8;
    (pSVar2->intr).super_Interaction.time = FStack_2c0;
    (pSVar2->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = fStack_2bc;
    (pSVar2->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = fStack_2b8;
    (pSVar2->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = fStack_2b4;
    (pSVar2->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = aTStack_2b0[0].x;
    (pSVar2->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_2b0[0].y;
    *(undefined8 *)&(pSVar2->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
         aTStack_2b0._8_8_;
    *(undefined8 *)&(pSVar2->intr).super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
         aTStack_2b0[1]._4_8_;
    (pSVar2->intr).super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (uintptr_t)
            local_290.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    (pSVar2->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.x = aTStack_258[0].x;
    (pSVar2->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_258[0].y;
    *(undefined8 *)&(pSVar2->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
         aTStack_258._8_8_;
    (pSVar2->intr).shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y = aTStack_258[1].y;
    (pSVar2->intr).shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z = aTStack_258[1].z;
    (pSVar2->intr).shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x = aTStack_240[0].x;
    (pSVar2->intr).shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y = aTStack_240[0].y;
    *(undefined8 *)&(pSVar2->intr).shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         aTStack_240._8_8_;
    (pSVar2->intr).shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_240[1].y;
    (pSVar2->intr).shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z = aTStack_240[1].z;
    (pSVar2->intr).shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x = TStack_228.x;
    (pSVar2->intr).shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y = TStack_228.y;
    *(undefined8 *)&(pSVar2->intr).shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         stack0xfffffffffffffde0;
    (pSVar2->intr).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = local_288[0].x;
    (pSVar2->intr).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = local_288[0].y;
    *(undefined8 *)&(pSVar2->intr).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = local_288._8_8_;
    (pSVar2->intr).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = local_288[1].y;
    (pSVar2->intr).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = local_288[1].z;
    (pSVar2->intr).dndu.super_Tuple3<pbrt::Normal3,_float>.x = aTStack_270[0].x;
    (pSVar2->intr).dndu.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_270[0].y;
    *(undefined8 *)&(pSVar2->intr).dndu.super_Tuple3<pbrt::Normal3,_float>.z = aTStack_270._8_8_;
    (pSVar2->intr).dndv.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_270[1].y;
    (pSVar2->intr).dndv.super_Tuple3<pbrt::Normal3,_float>.z = aTStack_270[1].z;
    (pSVar2->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.x = aTStack_258[0].x;
    (pSVar2->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_258[0].y;
    *(undefined8 *)&(pSVar2->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
         aTStack_258._8_8_;
    (pSVar2->intr).material.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = (uintptr_t)
            local_218.
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    (pSVar2->intr).areaLight.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = (uintptr_t)
            LStack_210.
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    (pSVar2->intr).dudy = local_208[2].z;
    (pSVar2->intr).dvdy = FStack_1e4;
    (pSVar2->intr).dpdx.super_Tuple3<pbrt::Vector3,_float>.x = local_208[0].x;
    (pSVar2->intr).dpdx.super_Tuple3<pbrt::Vector3,_float>.y = local_208[0].y;
    *(undefined8 *)&(pSVar2->intr).dpdx.super_Tuple3<pbrt::Vector3,_float>.z = local_208._8_8_;
    (pSVar2->intr).dpdy.super_Tuple3<pbrt::Vector3,_float>.y = local_208[1].y;
    (pSVar2->intr).dpdy.super_Tuple3<pbrt::Vector3,_float>.z = local_208[1].z;
    (pSVar2->intr).dudx = local_208[2].x;
    (pSVar2->intr).dvdx = local_208[2].y;
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    pSVar3 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    va = Dot<float>(&(pSVar2->intr).super_Interaction.n,&(pSVar3->intr).shading.n);
    vb = 0;
    if (va < 0.0) {
      LogFatal<char_const(&)[36],char_const(&)[2],char_const(&)[36],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/primitive.cpp"
                 ,0xa0,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(char (*) [2])0x53f2eb,
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(float *)&va,
                 (char (*) [2])0x53f2eb,&vb);
    }
    pstd::optional<pbrt::ShapeIntersection>::optional(__return_storage_ptr__,&si);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> AnimatedPrimitive::Intersect(const Ray &r,
                                                               Float tMax) const {
    // Compute _ray_ after transformation by _renderFromPrimitive_
    Transform interpRenderFromPrimitive = renderFromPrimitive.Interpolate(r.time);
    Ray ray = interpRenderFromPrimitive.ApplyInverse(r, &tMax);
    pstd::optional<ShapeIntersection> si = primitive.Intersect(ray, tMax);
    if (!si)
        return {};

    // Transform instance's intersection data to rendering space
    si->intr = interpRenderFromPrimitive(si->intr);
    CHECK_GE(Dot(si->intr.n, si->intr.shading.n), 0);
    return si;
}